

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  uint uVar1;
  TPZFMatrix<double> *pTVar2;
  TPZFMatrix<double> *pTVar3;
  TPZConnect *pTVar4;
  int64_t iVar5;
  TPZCompEl *pTVar6;
  TPZCompMesh *pTVar7;
  long lVar8;
  int iVar9;
  int64_t iVar10;
  ulong uVar11;
  int64_t el;
  long lVar12;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816478;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar10 = local_50.fNElements;
  pTVar2 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  lVar8 = 0;
  do {
    if (lVar8 == iVar10) {
      lVar8 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar12 = 0;
      if (lVar8 < 1) {
        lVar8 = lVar12;
      }
      for (; lVar8 != lVar12; lVar12 = lVar12 + 1) {
        pTVar6 = TPZCompMesh::Element(MFMesh,lVar12);
        if ((pTVar6 != (TPZCompEl *)0x0) &&
           (pTVar7 = (TPZCompMesh *)
                     __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918),
           pTVar7 != (TPZCompMesh *)0x0)) {
          TransferFromMultiPhysics(cmeshVec,pTVar7);
        }
      }
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec(&local_50);
      return;
    }
    pTVar7 = local_50.fStore[lVar8].first;
    if (pTVar7 != (TPZCompMesh *)0x0) {
      pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar7->fSolution);
      pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar7->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          local_50.fStore[lVar8].second);
      if (pTVar4->fSequenceNumber < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x1aa);
      }
      iVar9 = (int)pTVar4->fSequenceNumber;
      uVar1 = (pTVar7->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar9].dim;
      pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar8);
      lVar12 = pTVar4->fSequenceNumber;
      if (lVar12 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x1ae);
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
        iVar5 = TPZBlock::Index(&MFMesh->fBlock,lVar12,(int)uVar11);
        pTVar3->fElem
        [(long)(pTVar7->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar9].pos + uVar11] =
             pTVar2->fElem[iVar5];
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}